

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_write_change_cipher_spec(mbedtls_ssl_context *ssl)

{
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x1404,"=> write change cipher spec");
  ssl->out_msgtype = 0x14;
  ssl->out_msglen = 1;
  *ssl->out_msg = '\x01';
  ssl->state = ssl->state + 1;
  ssl_local._4_4_ = mbedtls_ssl_write_handshake_msg(ssl);
  if (ssl_local._4_4_ == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x1411,"<= write change cipher spec");
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x140d,"mbedtls_ssl_write_handshake_msg",ssl_local._4_4_);
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_write_change_cipher_spec(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write change cipher spec"));

    ssl->out_msgtype = MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC;
    ssl->out_msglen  = 1;
    ssl->out_msg[0]  = 1;

    ssl->state++;

    if ((ret = mbedtls_ssl_write_handshake_msg(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_write_handshake_msg", ret);
        return ret;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write change cipher spec"));

    return 0;
}